

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.c
# Opt level: O0

int mpt_log(mpt_logger *out,char *where,int type,char *fmt,...)

{
  char in_AL;
  int iVar1;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_108 [32];
  undefined8 local_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined4 local_48;
  int err;
  va_list ap;
  char *fmt_local;
  int type_local;
  char *where_local;
  mpt_logger *out_local;
  
  if (in_AL != '\0') {
    local_d8 = in_XMM0_Qa;
    local_c8 = in_XMM1_Qa;
    local_b8 = in_XMM2_Qa;
    local_a8 = in_XMM3_Qa;
    local_98 = in_XMM4_Qa;
    local_88 = in_XMM5_Qa;
    local_78 = in_XMM6_Qa;
    local_68 = in_XMM7_Qa;
  }
  ap[0].overflow_arg_area = local_108;
  ap[0]._0_8_ = &stack0x00000008;
  err = 0x30;
  local_48 = 0x20;
  local_e8 = in_R8;
  local_e0 = in_R9;
  where_local = (char *)out;
  if (out == (mpt_logger *)0x0) {
    where_local = (char *)mpt_log_default();
  }
  fmt_local._4_4_ = type;
  if (((type & 0x7fU) != 0) && ((type & 0x20U) == 0)) {
    fmt_local._4_4_ = type | 0xb00;
  }
  iVar1 = (*(code *)**(undefined8 **)where_local)(where_local,where,fmt_local._4_4_,fmt,&local_48);
  return iVar1;
}

Assistant:

extern int mpt_log(MPT_INTERFACE(logger) *out, const char *where, int type, const char *fmt, ... )
{
	va_list ap;
	int err;
	
	va_start(ap, fmt);
	
	if (!out) out = mpt_log_default();
	if (type & 0x7f && !(type & MPT_LOG(File))) {
		type |= MPT_ENUM(LogPretty) | MPT_ENUM(LogFunction);
	}
	err = out->_vptr->log(out, where, type, fmt, ap);
	va_end(ap);
	
	return err;
}